

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O1

Mat operator*(double value,Mat *Matrix)

{
  int iVar1;
  int iVar2;
  long lVar3;
  double *pdVar4;
  double *in_RDX;
  double *extraout_RDX;
  uint uVar5;
  int *in_RSI;
  Mat MVar6;
  
  iVar1 = *in_RSI;
  iVar2 = in_RSI[1];
  Matrix->n_rows_ = iVar1;
  Matrix->n_cols_ = iVar2;
  uVar5 = iVar2 * iVar1;
  if ((int)uVar5 < 1) {
    pdVar4 = (double *)0x0;
  }
  else {
    pdVar4 = (double *)operator_new__((long)(ulong)uVar5 * 8);
    in_RDX = extraout_RDX;
  }
  Matrix->v_ = pdVar4;
  if (0 < (int)uVar5) {
    lVar3 = *(long *)(in_RSI + 2);
    in_RDX = (double *)0x0;
    do {
      pdVar4[(long)in_RDX] = *(double *)(lVar3 + (long)in_RDX * 8) * value;
      in_RDX = (double *)((long)in_RDX + 1);
    } while ((double *)(ulong)uVar5 != in_RDX);
  }
  MVar6.v_ = in_RDX;
  MVar6._0_8_ = Matrix;
  return MVar6;
}

Assistant:

Mat operator*(double value, const Mat& Matrix)
{
	int nEl = Matrix.n_rows_*Matrix.n_cols_;
	Mat Aux(Matrix.n_rows_, Matrix.n_cols_);
	for (int i=0; i<nEl; i++) 	
		Aux.v_[i] = value*Matrix.v_[i];
	return Aux;
}